

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ulong smf::MidiFile::readLittleEndian4Bytes(istream *input)

{
  ulong uVar1;
  ostream *this;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  istream *piStack_18;
  uchar buffer [4];
  istream *input_local;
  
  piStack_18 = input;
  memset(&local_1c,0,4);
  std::istream::read((char *)piStack_18,(long)&local_1c);
  uVar1 = std::ios::eof();
  if ((uVar1 & 1) == 0) {
    input_local = (istream *)(long)CONCAT13(local_1c,CONCAT12(local_1b,CONCAT11(local_1a,local_19)))
    ;
  }
  else {
    this = std::operator<<((ostream *)&std::cerr,"Error: unexpected end of file.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    input_local = (istream *)0x0;
  }
  return (ulong)input_local;
}

Assistant:

ulong MidiFile::readLittleEndian4Bytes(std::istream& input) {
	uchar buffer[4] = {0};
	input.read((char*)buffer, 4);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	}
	return buffer[3] | (buffer[2] << 8) | (buffer[1] << 16) | (buffer[0] << 24);
}